

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

List<Kernel::TermList> ** __thiscall
Lib::Map<unsigned_int,_Lib::List<Kernel::TermList>_*,_Lib::DefaultHash>::insert
          (Map<unsigned_int,_Lib::List<Kernel::TermList>_*,_Lib::DefaultHash> *this,uint *key,
          List<Kernel::TermList> **val,uint code)

{
  MaybeUninit<Lib::List<Kernel::TermList>_*> MVar1;
  Entry *pEVar2;
  
  pEVar2 = this->_entries + (ulong)code % (ulong)(uint)this->_capacity;
  while( true ) {
    if (pEVar2->code == 0) {
      this->_noOfEntries = this->_noOfEntries + 1;
      MVar1 = (MaybeUninit<Lib::List<Kernel::TermList>_*>)*val;
      pEVar2->_key = (MaybeUninit<unsigned_int>)*key;
      pEVar2->_value = MVar1;
      pEVar2->code = code;
      return (List<Kernel::TermList> **)&pEVar2->_value;
    }
    if ((pEVar2->code == code) && (pEVar2->_key == (MaybeUninit<unsigned_int>)*key)) break;
    pEVar2 = pEVar2 + 1;
    if (pEVar2 == this->_afterLast) {
      pEVar2 = this->_entries;
    }
  }
  return (List<Kernel::TermList> **)&pEVar2->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }